

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_rep_btree_reader.h
# Opt level: O0

string_view __thiscall
absl::cord_internal::CordRepBtreeReader::Seek(CordRepBtreeReader *this,size_t offset)

{
  size_t sVar1;
  long lVar2;
  size_type sVar3;
  string_view sVar4;
  string_view local_48;
  undefined1 local_38 [8];
  Position pos;
  size_t offset_local;
  CordRepBtreeReader *this_local;
  string_view chunk;
  
  pos.offset = offset;
  _local_38 = CordRepBtreeNavigator::Seek(&this->navigator_,offset);
  if (local_38 == (undefined1  [8])0x0) {
    this->remaining_ = 0;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
  }
  else {
    local_48 = EdgeData((CordRep *)local_38);
    _this_local = std::basic_string_view<char,_std::char_traits<char>_>::substr
                            (&local_48,(size_type)pos.edge,0xffffffffffffffff);
    sVar1 = length(this);
    lVar2 = sVar1 - pos.offset;
    sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::length
                      ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
    this->remaining_ = lVar2 - sVar3;
  }
  sVar4._M_len = (size_t)this_local;
  sVar4._M_str = (char *)chunk._M_len;
  return sVar4;
}

Assistant:

inline absl::string_view CordRepBtreeReader::Seek(size_t offset) {
  const CordRepBtreeNavigator::Position pos = navigator_.Seek(offset);
  if (ABSL_PREDICT_FALSE(pos.edge == nullptr)) {
    remaining_ = 0;
    return {};
  }
  absl::string_view chunk = EdgeData(pos.edge).substr(pos.offset);
  remaining_ = length() - offset - chunk.length();
  return chunk;
}